

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O0

void __thiscall
SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
::Remove(SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
         *this,void *key,PinRecord *pOut)

{
  bool bVar1;
  uint uVar2;
  EntryType *local_38;
  EntryType *current;
  EntryType **prev;
  uint val;
  PinRecord *pOut_local;
  void *key_local;
  SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
  *this_local;
  
  uVar2 = HashKeyToBucket(this,key);
  current = (EntryType *)(this->table + uVar2);
  local_38 = (EntryType *)current->key;
  while( true ) {
    if (local_38 == (EntryType *)0x0) {
      return;
    }
    bVar1 = DefaultComparer<void_*>::Equals(key,local_38->key);
    if (bVar1) break;
    current = (EntryType *)&local_38->next;
    local_38 = local_38->next;
  }
  current->key = local_38->next;
  if (pOut != (PinRecord *)0x0) {
    pOut->stackBackTraces = (local_38->value).stackBackTraces;
    pOut->refCount = (local_38->value).refCount;
  }
  FreeEntry(this,local_38);
  if (this->stats == (DictionaryStats *)0x0) {
    return;
  }
  DictionaryStats::Remove(this->stats,this->table[uVar2] == (EntryType *)0x0);
  return;
}

Assistant:

void Remove(TKey key, TData* pOut)
    {
        uint val = HashKeyToBucket(key);
        EntryType **prev=&table[val];
        for (EntryType * current = *prev ; current != nullptr; current = current->next)
        {
            if (Comparer<TKey>::Equals(key, current->key))
            {
                *prev = current->next;
                if (pOut != nullptr)
                {
                    (*pOut) = current->value;
                }

                FreeEntry(current);
#if PROFILE_DICTIONARY
                if (stats)
                    stats->Remove(table[val] == nullptr);
#endif
                break;
            }
            prev = &current->next;
        }
    }